

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

void * curve_new(t_symbol *classsym,int argc,t_atom *argv)

{
  t_float tVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  t_pd *object;
  _glist *p_Var6;
  ulong uVar7;
  t_pd fd;
  undefined4 uVar8;
  ulong uVar9;
  char *flag;
  t_atom *argv_00;
  t_atom *argv_01;
  word *pwVar10;
  uint uVar11;
  bool bVar12;
  
  object = pd_new(curve_class);
  pcVar2 = classsym->s_name;
  p_Var6 = canvas_getcurrent();
  object[0x1d] = (t_pd)p_Var6;
  bVar12 = *pcVar2 == 'f';
  uVar7 = (ulong)bVar12;
  uVar9 = (ulong)(bVar12 + 2);
  if (pcVar2[uVar7 * 2 + 4] != 'c') {
    uVar9 = uVar7;
  }
  uVar8 = (undefined4)uVar9;
  *(undefined2 *)(object + 0x16) = 1;
  *(undefined4 *)(object + 0x17) = 0x3f800000;
  object[0x18] = (t_pd)0x0;
  object[0x19] = (t_pd)0x0;
  *(undefined4 *)(object + 0x1a) = 0;
  if (argc != 0) {
    do {
      uVar11 = (uint)uVar9;
      if ((argv->a_type != A_SYMBOL) || (pcVar2 = ((argv->a_w).w_symbol)->s_name, *pcVar2 != '-')) {
        *(uint *)(object + 6) = uVar11;
        argv_00 = argv;
        if ((uVar9 & 1) == 0) goto LAB_0015cbc8;
        iVar3 = argc + -1;
        argv_00 = argv + 1;
        fielddesc_setfloatarg((_fielddesc *)(object + 7),argc,argv);
        goto LAB_0015cbfc;
      }
      if ((pcVar2[1] == 'n') && (pcVar2[2] == '\0')) {
        *(undefined2 *)(object + 0x16) = 1;
        *(undefined4 *)(object + 0x17) = 0;
        *(undefined4 *)(object + 0x1a) = 0;
        object[0x18] = (t_pd)0x0;
        object[0x19] = (t_pd)0x0;
      }
      else if ((pcVar2[1] == 'v') && ((1 < argc && (pcVar2[2] == '\0')))) {
        if (argv[1].a_type == A_SYMBOL) {
          fielddesc_setfloat_var((_fielddesc *)(object + 0x16),argv[1].a_w.w_symbol);
        }
        else {
          tVar1 = argv[1].a_w.w_float;
          *(undefined2 *)(object + 0x16) = 1;
          *(t_float *)(object + 0x17) = tVar1;
          object[0x18] = (t_pd)0x0;
          object[0x19] = (t_pd)0x0;
          *(undefined4 *)(object + 0x1a) = 0;
        }
        argv = argv + 1;
        argc = argc + -1;
      }
      else if ((pcVar2[1] == 'x') && (pcVar2[2] == '\0')) {
        uVar9 = (ulong)(uVar11 | 0xc);
      }
      else {
        iVar3 = strcmp(pcVar2,"-xr");
        if (iVar3 == 0) {
          uVar9 = (ulong)(uVar11 | 4);
        }
        else {
          iVar3 = strcmp(pcVar2,"-xe");
          if (iVar3 == 0) {
            uVar9 = (ulong)(uVar11 | 8);
          }
          else {
            iVar3 = strcmp(pcVar2,"-xv");
            if (iVar3 == 0) {
              uVar9 = (ulong)(uVar11 | 0x10);
            }
            else {
              pd_error(object,"%s: unknown flag \'%s\'...",classsym->s_name,pcVar2);
            }
          }
        }
      }
      uVar8 = (undefined4)uVar9;
      argv = argv + 1;
      argc = argc + -1;
    } while (argc != 0);
  }
  *(undefined4 *)(object + 6) = uVar8;
  argc = 0;
  argv_00 = argv;
LAB_0015cbc8:
  *(undefined2 *)(object + 7) = 1;
  *(undefined4 *)(object + 8) = 0;
  object[9] = (t_pd)0x0;
  object[10] = (t_pd)0x0;
  *(undefined4 *)(object + 0xb) = 0;
  iVar3 = argc;
LAB_0015cbfc:
  if (iVar3 == 0) {
    *(undefined2 *)(object + 0xc) = 1;
    *(undefined4 *)(object + 0xd) = 0;
    object[0xe] = (t_pd)0x0;
    object[0xf] = (t_pd)0x0;
    *(undefined4 *)(object + 0x10) = 0;
    argv_01 = argv_00;
  }
  else {
    argv_01 = argv_00 + 1;
    fielddesc_setfloatarg((_fielddesc *)(object + 0xc),iVar3,argv_00);
    if (iVar3 + -1 != 0) {
      uVar11 = iVar3 - 2;
      fielddesc_setfloatarg((_fielddesc *)(object + 0x11),iVar3 + -1,argv_01);
      argv_01 = argv_00 + 2;
      goto LAB_0015cc7e;
    }
  }
  *(undefined2 *)(object + 0x11) = 1;
  *(undefined4 *)(object + 0x12) = 0x3f800000;
  object[0x13] = (t_pd)0x0;
  object[0x14] = (t_pd)0x0;
  *(undefined4 *)(object + 0x15) = 0;
  uVar11 = 0;
LAB_0015cc7e:
  uVar4 = 0;
  if (0 < (int)uVar11) {
    uVar4 = uVar11;
  }
  uVar5 = uVar4 + (uVar4 & 1);
  *(uint *)(object + 0x1b) = uVar5 >> 1;
  fd = (t_pd)getbytes((ulong)uVar5 * 0x28);
  object[0x1c] = fd;
  if (0 < (int)uVar11) {
    pwVar10 = &argv_01->a_w;
    do {
      if (((t_atom *)(pwVar10 + -1))->a_type == A_SYMBOL) {
        fielddesc_setfloat_var((_fielddesc *)fd,pwVar10->w_symbol);
      }
      else {
        tVar1 = pwVar10->w_float;
        *(undefined2 *)&fd->c_name = 1;
        *(t_float *)&fd->c_helpname = tVar1;
        fd->c_externdir = (t_symbol *)0x0;
        fd->c_size = 0;
        *(undefined4 *)&fd->c_methods = 0;
      }
      fd = (t_pd)&fd->c_nmethod;
      pwVar10 = pwVar10 + 2;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  if ((uVar4 & 1) != 0) {
    *(undefined2 *)&fd->c_name = 1;
    *(undefined4 *)&fd->c_helpname = 0;
    fd->c_externdir = (t_symbol *)0x0;
    fd->c_size = 0;
    *(undefined4 *)&fd->c_methods = 0;
  }
  return object;
}

Assistant:

static void *curve_new(t_symbol *classsym, int argc, t_atom *argv)
{
    t_curve *x = (t_curve *)pd_new(curve_class);
    const char *classname = classsym->s_name;
    int flags = 0;
    int nxy, i;
    t_fielddesc *fd;
    x->x_canvas = canvas_getcurrent();
    if (classname[0] == 'f')
    {
        classname += 6;
        flags |= CLOSED;
    }
    else classname += 4;
    if (classname[0] == 'c') flags |= BEZ;
    fielddesc_setfloat_const(&x->x_vis, 1);
    while (argc && argv->a_type == A_SYMBOL &&
        *argv->a_w.w_symbol->s_name == '-')
    {
        const char *flag = argv->a_w.w_symbol->s_name;
        if (!strcmp(flag, "-n"))
        {
            fielddesc_setfloat_const(&x->x_vis, 0);
        }
        else if (!strcmp(flag, "-v") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_vis, 1, argv+1);
            argc -= 1; argv += 1;
        }
        else if (!strcmp(flag, "-x"))
        {
            /* disable all mouse interaction */
            flags |= (NOMOUSERUN | NOMOUSEEDIT);
        }
        else if (!strcmp(flag, "-xr"))
        {
            /* disable mouse actions in run mode */
            flags |= NOMOUSERUN;
        }
        else if (!strcmp(flag, "-xe"))
        {
            /* disable mouse actions in edit mode */
            flags |= NOMOUSEEDIT;
        }
        else if (!strcmp(flag, "-xv"))
        {
            /* disable changing vertices in run mode */
            flags |= NOVERTICES;
        }
        else
        {
            pd_error(x, "%s: unknown flag '%s'...", classsym->s_name,
                flag);
        }
        argc--; argv++;
    }
    x->x_flags = flags;
    if ((flags & CLOSED) && argc)
        fielddesc_setfloatarg(&x->x_fillcolor, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_fillcolor, 0);
    if (argc) fielddesc_setfloatarg(&x->x_outlinecolor, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_outlinecolor, 0);
    if (argc) fielddesc_setfloatarg(&x->x_width, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_width, 1);
    if (argc < 0) argc = 0;
    nxy =  (argc + (argc & 1));
    x->x_npoints = (nxy>>1);
    x->x_vec = (t_fielddesc *)t_getbytes(nxy * sizeof(t_fielddesc));
    for (i = 0, fd = x->x_vec; i < argc; i++, fd++, argv++)
        fielddesc_setfloatarg(fd, 1, argv);
    if (argc & 1) fielddesc_setfloat_const(fd, 0);

    return (x);
}